

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_json_read_invalid(void)

{
  bson_t bson;
  int r;
  bson_json_reader_t *reader;
  bson_error_t error;
  undefined4 local_380;
  undefined4 local_37c;
  undefined1 local_378;
  int local_29c;
  undefined8 local_298;
  int local_290;
  int local_28c;
  
  memset(&local_380,0,0x80);
  local_380 = 3;
  local_37c = 5;
  local_378 = 5;
  local_298 = bson_json_reader_new(0,test_bson_json_read_invalid_helper,0,0);
  local_29c = bson_json_reader_read(local_298,&local_380,&local_290);
  if (local_29c != -1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x5aa,"test_bson_json_read_invalid","r == -1");
    abort();
  }
  if (local_290 != 1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x5ab,"test_bson_json_read_invalid","error.domain == BSON_ERROR_JSON");
    abort();
  }
  if (local_28c != 1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x5ac,"test_bson_json_read_invalid","error.code == BSON_JSON_ERROR_READ_CORRUPT_JS");
    abort();
  }
  bson_json_reader_destroy(local_298);
  bson_destroy(&local_380);
  return;
}

Assistant:

static void
test_bson_json_read_invalid (void)
{
   bson_error_t error;
   bson_json_reader_t *reader;
   int r;
   bson_t bson = BSON_INITIALIZER;

   reader = bson_json_reader_new (
      NULL, test_bson_json_read_invalid_helper, NULL, false, 0);

   r = bson_json_reader_read (reader, &bson, &error);

   BSON_ASSERT (r == -1);
   BSON_ASSERT (error.domain == BSON_ERROR_JSON);
   BSON_ASSERT (error.code == BSON_JSON_ERROR_READ_CORRUPT_JS);

   bson_json_reader_destroy (reader);
   bson_destroy (&bson);
}